

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

void add_pax_attr_int(archive_string *as,char *key,int64_t value)

{
  char *value_00;
  char tmp [25];
  char local_20 [16];
  
  local_20[0] = '\0';
  value_00 = format_int(local_20,value);
  add_pax_attr(as,key,value_00);
  return;
}

Assistant:

static void
add_pax_attr_int(struct archive_string *as, const char *key, int64_t value)
{
	char tmp[1 + 3 * sizeof(value)];

	tmp[sizeof(tmp) - 1] = 0;
	add_pax_attr(as, key, format_int(tmp + sizeof(tmp) - 1, value));
}